

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void destroy_size(FT_Memory memory,FT_Size size,FT_Driver driver)

{
  FT_Driver driver_local;
  FT_Size size_local;
  FT_Memory memory_local;
  
  if ((size->generic).finalizer != (FT_Generic_Finalizer)0x0) {
    (*(size->generic).finalizer)(size);
  }
  if (driver->clazz->done_size != (FT_Size_DoneFunc)0x0) {
    (*driver->clazz->done_size)(size);
  }
  ft_mem_free(memory,size->internal);
  size->internal = (FT_Size_Internal)0x0;
  ft_mem_free(memory,size);
  return;
}

Assistant:

static void
  destroy_size( FT_Memory  memory,
                FT_Size    size,
                FT_Driver  driver )
  {
    /* finalize client-specific data */
    if ( size->generic.finalizer )
      size->generic.finalizer( size );

    /* finalize format-specific stuff */
    if ( driver->clazz->done_size )
      driver->clazz->done_size( size );

    FT_FREE( size->internal );
    FT_FREE( size );
  }